

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_MINDEX(TT_ExecContext exc,FT_Long *args)

{
  long lVar1;
  FT_Long FVar2;
  FT_Long K;
  FT_Long L;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  lVar1 = *args;
  if ((lVar1 < 1) || (exc->args < lVar1)) {
    if (exc->pedantic_hinting != '\0') {
      exc->error = 0x86;
    }
  }
  else {
    FVar2 = exc->stack[exc->args - lVar1];
    memmove(exc->stack + (exc->args - lVar1),exc->stack + (exc->args - lVar1) + 1,(lVar1 + -1) * 8);
    exc->stack[exc->args + -1] = FVar2;
  }
  return;
}

Assistant:

static void
  Ins_MINDEX( TT_ExecContext  exc,
              FT_Long*        args )
  {
    FT_Long  L, K;


    L = args[0];

    if ( L <= 0 || L > exc->args )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
    }
    else
    {
      K = exc->stack[exc->args - L];

      FT_ARRAY_MOVE( &exc->stack[exc->args - L    ],
                     &exc->stack[exc->args - L + 1],
                     ( L - 1 ) );

      exc->stack[exc->args - 1] = K;
    }
  }